

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<12>::Type(Type<12> *this,Type<12> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  (this->super_Base).MT_ = (param_1->super_Base).MT_;
  *(undefined4 *)&(this->super_Base).field_0x14 = uVar2;
  uVar2 = *(undefined4 *)
           &(param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar2;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                     *)&this->photon_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<12>::Multiplicities,_njoy::ENDFtk::section::Type<12>::TransitionProbabilities>
                     *)&param_1->photon_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 12 > : protected Base {

  public:

    #include "ENDFtk/section/12/TotalMultiplicity.hpp"
    #include "ENDFtk/section/12/PartialMultiplicity.hpp"

    #include "ENDFtk/section/12/Multiplicities.hpp"               // LO=1
    #include "ENDFtk/section/12/TransitionProbabilities.hpp"      // LO=2

    using LO1 = Multiplicities;
    using LO2 = TransitionProbabilities;

    /** @typedef PhotonProduction
     *  @brief The photon production multiplicities or transition probabilities
     *         of MF12
     *
     *  This photon production data class is set up as a variant.
     */
    using PhotonProduction =
              std::variant< Multiplicities,                      // LO=1
                            TransitionProbabilities >;           // LO=2

  private:

    /* fields */
    PhotonProduction photon_;

    /* auxiliary functions */
    #include "ENDFtk/section/12/src/readPhotonProduction.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/12/src/ctor.hpp"

    /* get methods */

    /**
     *  @brief Return the data type for the photon production data
     */
    int LO() const { return this->photon_.index() + 1; }

    /**
     *  @brief Return the data type for the photon production data
     */
    int representation() const { return this->LO(); }

    /**
     *  @brief Return the photon production data
     */
    const PhotonProduction& photonProduction() const { return this->photon_; }

    #include "ENDFtk/section/12/src/NC.hpp"
    #include "ENDFtk/section/12/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }